

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const>>
::redux<Eigen::internal::scalar_sum_op<double,double>>
          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const>>
           *this,scalar_sum_op<double,_double> *func)

{
  bool bVar1;
  undefined8 func_00;
  Index IVar2;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
  *pCVar3;
  Scalar SVar4;
  undefined1 local_30 [8];
  ThisEvaluator thisEval;
  scalar_sum_op<double,_double> *func_local;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
  *this_local;
  
  thisEval.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>,_Eigen::internal::IndexBased,_double>
  .m_d.argImpl.
  super_evaluator<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>.
  super_block_evaluator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  ._8_8_ = func;
  IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
          ::rows((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                  *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
            ::cols((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                    *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<const Eigen::Matrix<double, 3, 1>, 2, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<const Eigen::Matrix<double, 3, 1>, 2, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                 );
  }
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                      *)this);
  internal::
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
  ::redux_evaluator((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                     *)local_30,pCVar3);
  func_00 = thisEval.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>,_Eigen::internal::IndexBased,_double>
            .m_d.argImpl.
            super_evaluator<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>.
            super_block_evaluator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
            ._8_8_;
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                      *)this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const>>,3,2>
          ::
          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                      *)local_30,(scalar_sum_op<double,_double> *)func_00,pCVar3);
  internal::
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
  ::~redux_evaluator((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                      *)local_30);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}